

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::
make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator()(make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,stringstream *msg,char *arg,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string asStack_38 [32];
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  std::__cxx11::string::string(asStack_38,(string *)args);
  std::operator<<((ostream *)(msg + 0x10),asStack_38);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }